

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

void Aig_ManSuppCharAdd(uint *pBuffer,Vec_Int_t *vOne,int nPis)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < vOne->nSize) {
    piVar2 = vOne->pArray;
    lVar3 = 0;
    do {
      iVar1 = piVar2[lVar3];
      if (nPis <= iVar1) {
        __assert_fail("Entry < nPis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x1f5,"void Aig_ManSuppCharAdd(unsigned int *, Vec_Int_t *, int)");
      }
      pBuffer[iVar1 >> 5] = pBuffer[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vOne->nSize);
  }
  return;
}

Assistant:

void Aig_ManSuppCharAdd( unsigned * pBuffer, Vec_Int_t * vOne, int nPis )
{
    int i, Entry;
    Vec_IntForEachEntry( vOne, Entry, i )
    {
        assert( Entry < nPis );
        Abc_InfoSetBit( pBuffer, Entry );
    }
}